

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_env_test.c
# Opt level: O0

int main(void)

{
  undefined8 local_18;
  char *env_str_out;
  RK_U32 env_debug_u32;
  
  env_str_out._4_4_ = 0;
  env_str_out._0_4_ = 0x100;
  local_18 = 0;
  mpp_env_set_u32("test_env_debug",0x100);
  mpp_env_set_str("test_env_string",env_test_string);
  _mpp_log_l(4,"mpp_env_test","set env: %s to %u\n",0,"test_env_debug",env_str_out._0_4_);
  _mpp_log_l(4,"mpp_env_test","set env: %s to %s\n",0,"test_env_string",env_test_string);
  env_str_out._0_4_ = 0;
  _mpp_log_l(4,"mpp_env_test","start reading env:\n",0);
  mpp_env_get_u32("test_env_debug",&env_str_out,0);
  mpp_env_get_str("test_env_string",&local_18,0);
  _mpp_log_l(4,"mpp_env_test","get env: %s is %u\n",0,"test_env_debug",env_str_out._0_4_);
  _mpp_log_l(4,"mpp_env_test","get env: %s is %s\n",0,"test_env_string",local_18);
  return 0;
}

Assistant:

int main()
{
    RK_U32 env_debug_u32 = 0x100;
    const char *env_str_out = NULL;

    mpp_env_set_u32(env_debug, env_debug_u32);
    mpp_env_set_str(env_string, env_test_string);
    mpp_log("set env: %s to %u\n", env_debug, env_debug_u32);
    mpp_log("set env: %s to %s\n", env_string, env_test_string);

    env_debug_u32 = 0;
    mpp_log("start reading env:\n");

    mpp_env_get_u32(env_debug, &env_debug_u32, 0);
    mpp_env_get_str(env_string, &env_str_out, NULL);

    mpp_log("get env: %s is %u\n", env_debug, env_debug_u32);
    mpp_log("get env: %s is %s\n", env_string, env_str_out);

    return 0;
}